

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp:3007:19)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_tests_catch_amalgamated_cpp:3007:19)>
          *this,string *arg)

{
  string *in_RCX;
  string *arg_local;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_tests_catch_amalgamated_cpp:3007:19)>
  *this_local;
  
  invokeLambda<int,Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
            (__return_storage_ptr__,(Detail *)&this->m_lambda,
             (anon_class_8_1_50637480_for_m_lambda *)arg,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }